

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

int stbir__perform_build(STBIR_RESIZE *resize,int splits)

{
  int iVar1;
  stbir__info *info;
  stbir__info *out_info;
  int new_output_suby;
  int new_output_subx;
  stbir__sampler vertical;
  stbir__sampler horizontal;
  stbir__contributors conservative;
  int splits_local;
  STBIR_RESIZE *resize_local;
  
  memset(&horizontal.field_0x94,0,8);
  if (resize->samplers == (stbir__info *)0x0) {
    if (STBIR_FILTER_POINT_SAMPLE < resize->horizontal_filter) {
      __assert_fail("!((unsigned)resize->horizontal_filter >= STBIR_FILTER_OTHER)",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                    ,0x1e72,"int stbir__perform_build(STBIR_RESIZE *, int)");
    }
    if (resize->horizontal_filter < STBIR_FILTER_OTHER) {
      if (STBIR_FILTER_POINT_SAMPLE < resize->vertical_filter) {
        __assert_fail("!((unsigned)resize->vertical_filter >= STBIR_FILTER_OTHER)",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/stb_image_resize2.h"
                      ,0x1e73,"int stbir__perform_build(STBIR_RESIZE *, int)");
      }
      if (resize->vertical_filter < STBIR_FILTER_OTHER) {
        if (splits < 1) {
          resize_local._4_4_ = 0;
        }
        else {
          out_info._4_4_ = resize->output_subx;
          out_info._0_4_ = resize->output_suby;
          iVar1 = stbir__calculate_region_transform
                            ((stbir__scale_info *)&horizontal.gather_prescatter_coefficients,
                             resize->output_w,(int *)((long)&out_info + 4),resize->output_subw,
                             resize->input_w,resize->input_s0,resize->input_s1);
          if (iVar1 == 0) {
            resize_local._4_4_ = 0;
          }
          else {
            iVar1 = stbir__calculate_region_transform
                              ((stbir__scale_info *)&vertical.gather_prescatter_coefficients,
                               resize->output_h,(int *)&out_info,resize->output_subh,resize->input_h
                               ,resize->input_t0,resize->input_t1);
            if (iVar1 == 0) {
              resize_local._4_4_ = 0;
            }
            else if ((horizontal.gather_prescatter_coefficients._4_4_ == 0) ||
                    (vertical.gather_prescatter_coefficients._4_4_ == 0)) {
              resize_local._4_4_ = 0;
            }
            else {
              stbir__set_sampler((stbir__sampler *)&vertical.gather_prescatter_coefficients_size,
                                 resize->horizontal_filter,resize->horizontal_filter_kernel,
                                 resize->horizontal_filter_support,resize->horizontal_edge,
                                 (stbir__scale_info *)&horizontal.gather_prescatter_coefficients,1,
                                 resize->user_data);
              stbir__get_conservative_extents
                        ((stbir__sampler *)&vertical.gather_prescatter_coefficients_size,
                         (stbir__contributors *)&horizontal.field_0x94,resize->user_data);
              stbir__set_sampler((stbir__sampler *)&new_output_suby,resize->vertical_filter,
                                 resize->horizontal_filter_kernel,resize->vertical_filter_support,
                                 resize->vertical_edge,
                                 (stbir__scale_info *)&vertical.gather_prescatter_coefficients,0,
                                 resize->user_data);
              conservative.n0 = splits;
              if ((vertical.gather_prescatter_coefficients._4_4_ / splits < 4) &&
                 (conservative.n0 = vertical.gather_prescatter_coefficients._4_4_ / 4,
                 conservative.n0 == 0)) {
                conservative.n0 = 1;
              }
              info = stbir__alloc_internal_mem_and_build_samplers
                               ((stbir__sampler *)&vertical.gather_prescatter_coefficients_size,
                                (stbir__sampler *)&new_output_suby,
                                (stbir__contributors *)&horizontal.field_0x94,
                                resize->input_pixel_layout_public,resize->output_pixel_layout_public
                                ,conservative.n0,out_info._4_4_,(int)out_info,resize->fast_alpha,
                                resize->user_data);
              if (info == (stbir__info *)0x0) {
                resize_local._4_4_ = 0;
              }
              else {
                resize->splits = conservative.n0;
                resize->samplers = info;
                resize->needs_rebuild = 0;
                stbir__update_info_from_resize(info,resize);
                resize_local._4_4_ = conservative.n0;
              }
            }
          }
        }
      }
      else {
        resize_local._4_4_ = 0;
      }
    }
    else {
      resize_local._4_4_ = 0;
    }
  }
  else {
    resize_local._4_4_ = 0;
  }
  return resize_local._4_4_;
}

Assistant:

static int stbir__perform_build( STBIR_RESIZE * resize, int splits )
{
  stbir__contributors conservative = { 0, 0 };
  stbir__sampler horizontal, vertical;
  int new_output_subx, new_output_suby;
  stbir__info * out_info;
  #ifdef STBIR_PROFILE
  stbir__info profile_infod;  // used to contain building profile info before everything is allocated
  stbir__info * profile_info = &profile_infod;
  #endif

  // have we already built the samplers?
  if ( resize->samplers )
    return 0;

  #define STBIR_RETURN_ERROR_AND_ASSERT( exp )  STBIR_ASSERT( !(exp) ); if (exp) return 0;
  STBIR_RETURN_ERROR_AND_ASSERT( (unsigned)resize->horizontal_filter >= STBIR_FILTER_OTHER)
  STBIR_RETURN_ERROR_AND_ASSERT( (unsigned)resize->vertical_filter >= STBIR_FILTER_OTHER)
  #undef STBIR_RETURN_ERROR_AND_ASSERT

  if ( splits <= 0 )
    return 0;

  STBIR_PROFILE_BUILD_FIRST_START( build );

  new_output_subx = resize->output_subx;
  new_output_suby = resize->output_suby;

  // do horizontal clip and scale calcs
  if ( !stbir__calculate_region_transform( &horizontal.scale_info, resize->output_w, &new_output_subx, resize->output_subw, resize->input_w, resize->input_s0, resize->input_s1 ) )
    return 0;

  // do vertical clip and scale calcs
  if ( !stbir__calculate_region_transform( &vertical.scale_info, resize->output_h, &new_output_suby, resize->output_subh, resize->input_h, resize->input_t0, resize->input_t1 ) )
    return 0;

  // if nothing to do, just return
  if ( ( horizontal.scale_info.output_sub_size == 0 ) || ( vertical.scale_info.output_sub_size == 0 ) )
    return 0;

  stbir__set_sampler(&horizontal, resize->horizontal_filter, resize->horizontal_filter_kernel, resize->horizontal_filter_support, resize->horizontal_edge, &horizontal.scale_info, 1, resize->user_data );
  stbir__get_conservative_extents( &horizontal, &conservative, resize->user_data );
  stbir__set_sampler(&vertical, resize->vertical_filter, resize->horizontal_filter_kernel, resize->vertical_filter_support, resize->vertical_edge, &vertical.scale_info, 0, resize->user_data );

  if ( ( vertical.scale_info.output_sub_size / splits ) < STBIR_FORCE_MINIMUM_SCANLINES_FOR_SPLITS ) // each split should be a minimum of 4 scanlines (handwavey choice)
  {
    splits = vertical.scale_info.output_sub_size / STBIR_FORCE_MINIMUM_SCANLINES_FOR_SPLITS;
    if ( splits == 0 ) splits = 1;
  }

  STBIR_PROFILE_BUILD_START( alloc );
  out_info = stbir__alloc_internal_mem_and_build_samplers( &horizontal, &vertical, &conservative, resize->input_pixel_layout_public, resize->output_pixel_layout_public, splits, new_output_subx, new_output_suby, resize->fast_alpha, resize->user_data STBIR_ONLY_PROFILE_BUILD_SET_INFO );
  STBIR_PROFILE_BUILD_END( alloc );
  STBIR_PROFILE_BUILD_END( build );

  if ( out_info )
  {
    resize->splits = splits;
    resize->samplers = out_info;
    resize->needs_rebuild = 0;
    #ifdef STBIR_PROFILE
      STBIR_MEMCPY( &out_info->profile, &profile_infod.profile, sizeof( out_info->profile ) );
    #endif

    // update anything that can be changed without recalcing samplers
    stbir__update_info_from_resize( out_info, resize );

    return splits;
  }

  return 0;
}